

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O2

void __thiscall
StackTraceTableTestHelper::CheckTracesAndReset
          (StackTraceTableTestHelper *this,uintptr_t *expected,int len)

{
  ulong uVar1;
  char *message;
  ulong uVar2;
  AssertHelper local_58;
  internal local_50 [8];
  AssertionResult gtest_ar;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> entries;
  
  DumpTraces((StackTraceTableTestHelper *)&gtest_ar.message_);
  uVar1 = 0;
  uVar2 = (ulong)(uint)len;
  if (len < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 8 != uVar1; uVar1 = uVar1 + 8) {
    entries._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
    super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
    super__Head_base<0UL,_void_**,_false>._M_head_impl =
         *(__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true> *)
          &((__uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_> *)
           ((long)gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + uVar1))->_M_t;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_50,"reinterpret_cast<uintptr_t>(entries[i])","expected[i]",
               (unsigned_long *)&entries,(unsigned_long *)((long)expected + uVar1));
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&entries);
      message = "";
      if (gtest_ar._0_8_ != 0) {
        message = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stack_trace_table_test.cc"
                 ,0x33,message);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&entries);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((__uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>)
          entries._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
          super__Head_base<0UL,_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>)0x0) {
        (**(code **)(*(long *)entries._M_t.
                              super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                              super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                              super__Head_base<0UL,_void_**,_false>._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
  }
  std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr
            ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)&gtest_ar.message_);
  return;
}

Assistant:

void CheckTracesAndReset(const uintptr_t* expected, int len) {
    std::unique_ptr<void*[]> entries = DumpTraces();
    for (int i = 0; i < len; i++) {
      EXPECT_EQ(reinterpret_cast<uintptr_t>(entries[i]), expected[i]);
    }
  }